

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::javanano::MapFieldGenerator::GenerateMergingCode
          (MapFieldGenerator *this,Printer *printer)

{
  Printer *printer_local;
  MapFieldGenerator *this_local;
  
  io::Printer::Print(printer,&this->variables_,
                     "this.$name$ = com.google.protobuf.nano.InternalNano.mergeMapEntry(\n  input, this.$name$, mapFactory,\n  com.google.protobuf.nano.InternalNano.$key_desc_type$,\n  com.google.protobuf.nano.InternalNano.$value_desc_type$,\n  $value_default$,\n  $key_tag$, $value_tag$);\n\n"
                    );
  return;
}

Assistant:

void MapFieldGenerator::
GenerateMergingCode(io::Printer* printer) const {
  printer->Print(variables_,
    "this.$name$ = com.google.protobuf.nano.InternalNano.mergeMapEntry(\n"
    "  input, this.$name$, mapFactory,\n"
    "  com.google.protobuf.nano.InternalNano.$key_desc_type$,\n"
    "  com.google.protobuf.nano.InternalNano.$value_desc_type$,\n"
    "  $value_default$,\n"
    "  $key_tag$, $value_tag$);\n"
    "\n");
}